

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssign
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TOperator op_00;
  EShLanguage EVar1;
  _Base_ptr p_Var2;
  TIntermediate *pTVar3;
  _func_int **pp_Var4;
  HlslParseContext *pHVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermTyped *node;
  undefined4 extraout_var_06;
  TIntermTyped *pTVar12;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long lVar13;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  longlong lVar14;
  TVariable *pTVar15;
  TIntermSymbol *pTVar16;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermSymbol *pTVar17;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  TIntermAggregate *pTVar18;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  TQualifier *this_00;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  TIntermConstantUnion *index;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  TSourceLoc *pTVar21;
  bool isSplitRight;
  bool isSplitLeft;
  bool isFlattenLeft;
  bool isFlattenRight;
  TIntermAggregate *assignList;
  TStorageQualifier leftStorage;
  TVector<glslang::TVariable_*> *rightVariables;
  TVector<glslang::TVariable_*> *leftVariables;
  anon_class_8_1_8991fb9c assignsClipPos;
  int rightOffset;
  int leftOffset;
  int rightOffsetStart;
  int leftOffsetStart;
  TStorageQualifier rightStorage;
  vector<int,_std::allocator<int>_> arrayElement;
  anon_class_104_13_1d5e7770 getMember;
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  traverse;
  TType derefType;
  char local_1c8;
  char local_1c7;
  char local_1c6;
  char local_1c5;
  TOperator local_1c4;
  TSourceLoc *local_1c0;
  TIntermAggregate *local_1b8;
  TIntermSymbol *local_1b0;
  TVariable *local_1a8;
  uint local_19c;
  _Base_ptr *local_198;
  _Base_ptr *local_190;
  HlslParseContext *local_188;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  uint local_16c;
  void *local_168;
  undefined8 uStack_160;
  long local_158;
  char *local_150;
  undefined1 *local_148;
  HlslParseContext *local_140;
  uint *local_138;
  uint *local_130;
  void **local_128;
  TSourceLoc *local_120;
  int *local_118;
  _Base_ptr **local_110;
  int *local_108;
  int *local_100;
  _Base_ptr **local_f8;
  int *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  TType local_c8;
  
  if (right == (TIntermTyped *)0x0 || left == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  local_1c4 = op;
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x1b0))
                    ((long *)CONCAT44(extraout_var,iVar8));
  if (cVar6 != '\0') {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->needToLegalize = true;
  }
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left);
  if ((CONCAT44(extraout_var_00,iVar8) != 0) &&
     (iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left),
     *(int *)(CONCAT44(extraout_var_01,iVar8) + 0xb8) == 0x2d7)) {
    pTVar10 = handleAssignToMatrixSwizzle(this,loc,local_1c4,left,right);
    return pTVar10;
  }
  local_1c0 = loc;
  local_188 = this;
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x18])(left);
  pTVar10 = (TIntermTyped *)CONCAT44(extraout_var_02,iVar8);
  if (pTVar10 == (TIntermTyped *)0x0) {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar11 = (long *)CONCAT44(extraout_var_03,iVar8);
    if ((plVar11 == (long *)0x0) || (1 < (int)plVar11[0x17] - 0x33U)) {
      pTVar10 = (TIntermTyped *)0x0;
    }
    else {
      plVar11 = (long *)(**(code **)(*plVar11 + 400))(plVar11);
      pTVar10 = (TIntermTyped *)(**(code **)(*plVar11 + 0x60))(plVar11);
    }
  }
  iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x18])(right);
  node = (TIntermTyped *)CONCAT44(extraout_var_04,iVar8);
  if (node == (TIntermTyped *)0x0) {
    iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x14])(right);
    plVar11 = (long *)CONCAT44(extraout_var_05,iVar8);
    if ((plVar11 == (long *)0x0) || (1 < (int)plVar11[0x17] - 0x33U)) {
      node = (TIntermTyped *)0x0;
    }
    else {
      plVar11 = (long *)(**(code **)(*plVar11 + 400))(plVar11);
      node = (TIntermTyped *)(**(code **)(*plVar11 + 0x60))(plVar11);
    }
  }
  bVar7 = wasSplit(this,left);
  local_1c7 = true;
  if (!bVar7) {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar11 = (long *)CONCAT44(extraout_var_06,iVar8);
    if ((plVar11 == (long *)0x0) || (1 < (int)plVar11[0x17] - 0x33U)) {
      local_1c7 = false;
    }
    else {
      pTVar12 = (TIntermTyped *)(**(code **)(*plVar11 + 400))(plVar11);
      local_1c7 = wasSplit(this,pTVar12);
    }
  }
  bVar7 = wasSplit(this,right);
  local_1c8 = true;
  if (!bVar7) {
    iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x14])(right);
    plVar11 = (long *)CONCAT44(extraout_var_07,iVar8);
    if ((plVar11 == (long *)0x0) || (1 < (int)plVar11[0x17] - 0x33U)) {
      local_1c8 = false;
    }
    else {
      pTVar12 = (TIntermTyped *)(**(code **)(*plVar11 + 400))(plVar11);
      local_1c8 = wasSplit(this,pTVar12);
    }
  }
  local_1c6 = wasFlattened(this,pTVar10);
  local_1c5 = wasFlattened(this,node);
  if ((((!(bool)local_1c5) && (local_1c6 == '\0')) && (local_1c7 == '\0')) && (local_1c8 == '\0')) {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_25,iVar8));
    if (1 < (*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21) {
      iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
      lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar8) + 0x58))
                         ((long *)CONCAT44(extraout_var_26,iVar8));
      pHVar5 = local_188;
      if (1 < (*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21) {
        iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_31,iVar8) + 0x58))
                           ((long *)CONCAT44(extraout_var_31,iVar8));
        if ((((*(uint *)(lVar13 + 8) & 0xff80) == 0xf00) &&
            (EVar1 = (pHVar5->super_TParseContextBase).super_TParseVersions.language,
            EVar1 < EShLangFragment)) && (EVar1 != EShLangTessControl)) {
          pTVar10 = assignPosition(this,local_1c0,local_1c4,left,right);
          return pTVar10;
        }
        iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x21])(left);
        pTVar21 = local_1c0;
        if ((((*(uint *)(CONCAT44(extraout_var_32,iVar8) + 8) & 0xff80) == 0x2380) &&
            (iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x2a])(left), pTVar21 = local_1c0
            , (char)iVar8 != '\0')) &&
           (iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2a])(right),
           pTVar21 = local_1c0, (char)iVar8 == '\0')) {
          iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
          TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_33,iVar8),0,false);
          pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          index = TIntermediate::addConstantUnion(pTVar3,0,pTVar21,false);
          left = TIntermediate::addIndex
                           (pTVar3,EOpIndexDirect,left,&index->super_TIntermTyped,pTVar21);
          (*(left->super_TIntermNode)._vptr_TIntermNode[0x1d])(left,&local_c8);
        }
        pTVar10 = TIntermediate::addAssign
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_1c4,left,right,pTVar21);
        return pTVar10;
      }
    }
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_27,iVar8));
    pTVar10 = right;
    if ((*(uint *)(lVar13 + 8) >> 7 & 0x1ff) - 0x21 < 2) {
      pTVar10 = left;
    }
    iVar8 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_28,iVar8));
    pTVar18 = assignClipCullDistance
                        (this,local_1c0,local_1c4,*(uint *)(lVar13 + 0x1c) & 0xfff,left,right);
    return (TIntermTyped *)pTVar18;
  }
  iVar9 = 0;
  local_1b8 = (TIntermAggregate *)0x0;
  local_190 = (_Base_ptr *)0x0;
  local_198 = (_Base_ptr *)0x0;
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar8) + 0x128))
                    ((long *)CONCAT44(extraout_var_08,iVar8));
  if (cVar6 != '\0') {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    plVar11 = (long *)CONCAT44(extraout_var_09,iVar8);
    cVar6 = (**(code **)(*plVar11 + 0x128))(plVar11);
    if (cVar6 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    iVar9 = (int)((ulong)(*(long *)(plVar11[0xd] + 0x10) - *(long *)(plVar11[0xd] + 8)) >> 5);
  }
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar8) + 0xe8))
                    ((long *)CONCAT44(extraout_var_10,iVar8));
  if (cVar6 != '\0') {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar8) + 0x88))
                      ((long *)CONCAT44(extraout_var_11,iVar8));
  }
  if (local_1c6 == '\x01') {
    iVar8 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x30])(pTVar10);
    lVar13 = CONCAT44(extraout_var_12,iVar8);
    p_Var19 = &(this->flattenMap).
               super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var20 = p_Var19;
    for (p_Var2 = (this->flattenMap).
                  super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < lVar13]) {
      if (lVar13 <= *(long *)(p_Var2 + 1)) {
        p_Var20 = p_Var2;
      }
    }
    if ((p_Var20 != p_Var19) && (*(long *)(p_Var20 + 1) <= lVar13)) {
      p_Var19 = p_Var20;
    }
    local_190 = &p_Var19[1]._M_parent;
  }
  if (local_1c5 == '\x01') {
    iVar8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x30])(node);
    lVar13 = CONCAT44(extraout_var_13,iVar8);
    p_Var19 = &(this->flattenMap).
               super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var20 = p_Var19;
    for (p_Var2 = (this->flattenMap).
                  super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < lVar13]) {
      if (lVar13 <= *(long *)(p_Var2 + 1)) {
        p_Var20 = p_Var2;
      }
    }
    if ((p_Var20 != p_Var19) && (*(long *)(p_Var20 + 1) <= lVar13)) {
      p_Var19 = p_Var20;
    }
    local_198 = &p_Var19[1]._M_parent;
LAB_0040f3c9:
    local_1a8 = (TVariable *)0x0;
    local_1b0 = (TIntermSymbol *)0x0;
  }
  else {
    if (iVar9 < 2) goto LAB_0040f3c9;
    iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])(right);
    pp_Var4 = (right->super_TIntermNode)._vptr_TIntermNode;
    if (CONCAT44(extraout_var_23,iVar8) == 0) {
      iVar8 = (*pp_Var4[0x1e])(right);
      pTVar15 = makeInternalVariable(this,"flattenTemp",(TType *)CONCAT44(extraout_var_29,iVar8));
      iVar8 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xd])(pTVar15);
      this_00 = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar8) + 0x50))
                          ((long *)CONCAT44(extraout_var_30,iVar8));
      this_00->semanticName = (char *)0x0;
      *(ulong *)&this_00->field_0x8 = *(ulong *)&this_00->field_0x8 & 0xf80000141fff0000;
      TQualifier::clearLayout(this_00);
      pTVar21 = local_1c0;
      this_00->spirvStorageClass = -1;
      local_1b0 = (TIntermSymbol *)0x0;
      this_00->spirvDecorate = (TSpirvDecorate *)0x0;
      this_00->field_0xf = this_00->field_0xf & 0xe7;
      local_1a8 = pTVar15;
      pTVar17 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar15
                           ,local_1c0);
      pTVar18 = local_1b8;
      pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar10 = TIntermediate::addAssign
                          (pTVar3,local_1c4,&pTVar17->super_TIntermTyped,right,pTVar21);
      local_1b8 = TIntermediate::growAggregate
                            (pTVar3,(TIntermNode *)pTVar18,&pTVar10->super_TIntermNode,pTVar21);
    }
    else {
      iVar8 = (*pp_Var4[0xc])(right);
      local_1b0 = (TIntermSymbol *)CONCAT44(extraout_var_24,iVar8);
      local_1a8 = (TVariable *)0x0;
    }
  }
  local_168 = (void *)0x0;
  uStack_160 = 0;
  local_158 = 0;
  iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_14,iVar8));
  local_19c = *(uint *)(lVar13 + 8) & 0x7f;
  iVar8 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_15,iVar8));
  local_16c = *(uint *)(lVar13 + 8) & 0x7f;
  local_170 = findSubtreeOffset(this,&left->super_TIntermNode);
  local_17c = findSubtreeOffset(this,&right->super_TIntermNode);
  local_f0 = &local_174;
  local_118 = &local_178;
  local_178 = local_170;
  local_100 = &local_17c;
  local_150 = &local_1c7;
  local_128 = &local_168;
  local_120 = local_1c0;
  local_110 = &local_190;
  local_f8 = &local_198;
  local_174 = local_17c;
  local_140 = this;
  local_138 = &local_19c;
  local_130 = &local_16c;
  local_108 = &local_170;
  if (local_1a8 == (TVariable *)0x0) {
    local_148 = &local_1c8;
    if (local_1b0 != (TIntermSymbol *)0x0) {
      local_148 = &local_1c8;
      right = &TIntermediate::addSymbol
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          local_1b0)->super_TIntermTyped;
    }
  }
  else {
    local_148 = &local_1c8;
    right = &TIntermediate::addSymbol
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_1a8,
                        local_1c0)->super_TIntermTyped;
  }
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = operator_new(0x70);
  pTVar21 = local_1c0;
  *(char **)local_e8._M_unused._0_8_ = &local_1c6;
  *(HlslParseContext **)((long)local_e8._M_unused._0_8_ + 8) = this;
  *(uint **)((long)local_e8._M_unused._0_8_ + 0x10) = &local_19c;
  *(char **)((long)local_e8._M_unused._0_8_ + 0x18) = &local_1c5;
  *(uint **)((long)local_e8._M_unused._0_8_ + 0x20) = &local_16c;
  *(char **)((long)local_e8._M_unused._0_8_ + 0x28) = &local_1c7;
  *(char **)((long)local_e8._M_unused._0_8_ + 0x30) = &local_1c8;
  *(void ***)((long)local_e8._M_unused._0_8_ + 0x38) = &local_168;
  *(char ***)((long)local_e8._M_unused._0_8_ + 0x40) = &local_150;
  *(_Any_data **)((long)local_e8._M_unused._0_8_ + 0x48) = &local_e8;
  *(TIntermAggregate ***)((long)local_e8._M_unused._0_8_ + 0x50) = &local_1b8;
  *(TOperator **)((long)local_e8._M_unused._0_8_ + 0x58) = &local_1c4;
  *(TSourceLoc **)((long)local_e8._M_unused._0_8_ + 0x60) = local_1c0;
  *(HlslParseContext ***)((long)local_e8._M_unused._0_8_ + 0x68) = &local_188;
  pcStack_d0 = std::
               _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
             ::_M_manager;
  pTVar17 = (TIntermSymbol *)left;
  if (local_1c7 == '\x01') {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x14])(left);
    plVar11 = (long *)CONCAT44(extraout_var_16,iVar8);
    if ((plVar11 != (long *)0x0) && ((int)plVar11[0x17] - 0x33U < 2)) {
      pTVar10 = (TIntermTyped *)(**(code **)(*plVar11 + 400))(plVar11);
      bVar7 = wasSplit(this,pTVar10);
      if (bVar7) {
        iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar8) + 400))
                                    ((long *)CONCAT44(extraout_var_17,iVar8));
        plVar11 = (long *)(**(code **)(*plVar11 + 0x60))(plVar11);
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        lVar14 = (**(code **)(*plVar11 + 0x180))(plVar11);
        pTVar15 = getSplitNonIoVar(this,lVar14);
        pTVar16 = TIntermediate::addSymbol(pTVar3,pTVar15,pTVar21);
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        op_00 = *(TOperator *)(CONCAT44(extraout_var_18,iVar8) + 0xb8);
        iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
        pTVar10 = (TIntermTyped *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar8) + 0x198))
                            ((long *)CONCAT44(extraout_var_19,iVar8));
        pTVar21 = local_1c0;
        pTVar17 = (TIntermSymbol *)
                  TIntermediate::addIndex
                            (pTVar3,op_00,&pTVar16->super_TIntermTyped,pTVar10,local_1c0);
        iVar8 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar16);
        TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_20,iVar8),0,false);
        (*(pTVar17->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                  (pTVar17,&local_c8);
        goto LAB_0040f710;
      }
    }
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0xc])(left);
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar8) + 0x180))
                       ((long *)CONCAT44(extraout_var_21,iVar8));
    pTVar15 = getSplitNonIoVar(this,lVar14);
    pTVar17 = TIntermediate::addSymbol(pTVar3,pTVar15,pTVar21);
  }
LAB_0040f710:
  pTVar16 = (TIntermSymbol *)right;
  if (local_1c8 == '\x01') {
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar8 = (*(((TIntermSymbol *)right)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0xc])(right);
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar8) + 0x180))
                       ((long *)CONCAT44(extraout_var_22,iVar8));
    pTVar15 = getSplitNonIoVar(this,lVar14);
    pTVar16 = TIntermediate::addSymbol(pTVar3,pTVar15,pTVar21);
  }
  std::
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  ::operator()((function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                *)&local_e8,left,right,&pTVar17->super_TIntermTyped,&pTVar16->super_TIntermTyped,
               true);
  if (local_1b8 != (TIntermAggregate *)0x0) {
    (*(local_1b8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(local_1b8,1);
    pTVar18 = local_1b8;
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_168 != (void *)0x0) {
      operator_delete(local_168,local_158 - (long)local_168);
    }
    return (TIntermTyped *)pTVar18;
  }
  __assert_fail("assignList != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0xc98,
                "TIntermTyped *glslang::HlslParseContext::handleAssign(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
               );
}

Assistant:

TIntermTyped* HlslParseContext::handleAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                             TIntermTyped* right)
{
    if (left == nullptr || right == nullptr)
        return nullptr;

    // writing to opaques will require fixing transforms
    if (left->getType().containsOpaque())
        intermediate.setNeedsLegalization();

    if (left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle)
        return handleAssignToMatrixSwizzle(loc, op, left, right);

    // Return true if the given node is an index operation into a split variable.
    const auto indexesSplit = [this](const TIntermTyped* node) -> bool {
        const TIntermBinary* binaryNode = node->getAsBinaryNode();

        if (binaryNode == nullptr)
            return false;

        return (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect) &&
               wasSplit(binaryNode->getLeft());
    };

    // Return symbol if node is symbol or index ref
    const auto getSymbol = [](const TIntermTyped* node) -> const TIntermSymbol* {
        const TIntermSymbol* symbolNode = node->getAsSymbolNode();
        if (symbolNode != nullptr)
            return symbolNode;

        const TIntermBinary* binaryNode = node->getAsBinaryNode();
        if (binaryNode != nullptr && (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect))
            return binaryNode->getLeft()->getAsSymbolNode();

        return nullptr;
    };

    // Return true if this stage assigns clip position with potentially inverted Y
    const auto assignsClipPos = [this](const TIntermTyped* node) -> bool {
        return node->getType().getQualifier().builtIn == EbvPosition &&
               (language == EShLangVertex || language == EShLangGeometry || language == EShLangTessEvaluation);
    };

    const TIntermSymbol* leftSymbol = getSymbol(left);
    const TIntermSymbol* rightSymbol = getSymbol(right);

    const bool isSplitLeft    = wasSplit(left) || indexesSplit(left);
    const bool isSplitRight   = wasSplit(right) || indexesSplit(right);

    const bool isFlattenLeft  = wasFlattened(leftSymbol);
    const bool isFlattenRight = wasFlattened(rightSymbol);

    // OK to do a single assign if neither side is split or flattened.  Otherwise,
    // fall through to a member-wise copy.
    if (!isFlattenLeft && !isFlattenRight && !isSplitLeft && !isSplitRight) {
        // Clip and cull distance requires more processing.  See comment above assignClipCullDistance.
        if (isClipOrCullDistance(left->getType()) || isClipOrCullDistance(right->getType())) {
            const bool isOutput = isClipOrCullDistance(left->getType());

            const int semanticId = (isOutput ? left : right)->getType().getQualifier().layoutLocation;
            return assignClipCullDistance(loc, op, semanticId, left, right);
        } else if (assignsClipPos(left)) {
            // Position can require special handling: see comment above assignPosition
            return assignPosition(loc, op, left, right);
        } else if (left->getQualifier().builtIn == EbvSampleMask) {
            // Certain builtins are required to be arrayed outputs in SPIR-V, but may internally be scalars
            // in the shader.  Copy the scalar RHS into the LHS array element zero, if that happens.
            if (left->isArray() && !right->isArray()) {
                const TType derefType(left->getType(), 0);
                left = intermediate.addIndex(EOpIndexDirect, left, intermediate.addConstantUnion(0, loc), loc);
                left->setType(derefType);
                // Fall through to add assign.
            }
        }

        return intermediate.addAssign(op, left, right, loc);
    }

    TIntermAggregate* assignList = nullptr;
    const TVector<TVariable*>* leftVariables = nullptr;
    const TVector<TVariable*>* rightVariables = nullptr;

    // A temporary to store the right node's value, so we don't keep indirecting into it
    // if it's not a simple symbol.
    TVariable* rhsTempVar = nullptr;

    // If the RHS is a simple symbol node, we'll copy it for each member.
    TIntermSymbol* cloneSymNode = nullptr;

    int memberCount = 0;

    // Track how many items there are to copy.
    if (left->getType().isStruct())
        memberCount = (int)left->getType().getStruct()->size();
    if (left->getType().isArray())
        memberCount = left->getType().getCumulativeArraySize();

    if (isFlattenLeft)
        leftVariables = &flattenMap.find(leftSymbol->getId())->second.members;

    if (isFlattenRight) {
        rightVariables = &flattenMap.find(rightSymbol->getId())->second.members;
    } else {
        // The RHS is not flattened.  There are several cases:
        // 1. 1 item to copy:  Use the RHS directly.
        // 2. >1 item, simple symbol RHS: we'll create a new TIntermSymbol node for each, but no assign to temp.
        // 3. >1 item, complex RHS: assign it to a new temp variable, and create a TIntermSymbol for each member.

        if (memberCount <= 1) {
            // case 1: we'll use the symbol directly below.  Nothing to do.
        } else {
            if (right->getAsSymbolNode() != nullptr) {
                // case 2: we'll copy the symbol per iteration below.
                cloneSymNode = right->getAsSymbolNode();
            } else {
                // case 3: assign to a temp, and indirect into that.
                rhsTempVar = makeInternalVariable("flattenTemp", right->getType());
                rhsTempVar->getWritableType().getQualifier().makeTemporary();
                TIntermTyped* noFlattenRHS = intermediate.addSymbol(*rhsTempVar, loc);

                // Add this to the aggregate being built.
                assignList = intermediate.growAggregate(assignList,
                                                        intermediate.addAssign(op, noFlattenRHS, right, loc), loc);
            }
        }
    }

    // When dealing with split arrayed structures of built-ins, the arrayness is moved to the extracted built-in
    // variables, which is awkward when copying between split and unsplit structures.  This variable tracks
    // array indirections so they can be percolated from outer structs to inner variables.
    std::vector <int> arrayElement;

    TStorageQualifier leftStorage = left->getType().getQualifier().storage;
    TStorageQualifier rightStorage = right->getType().getQualifier().storage;

    int leftOffsetStart = findSubtreeOffset(*left);
    int rightOffsetStart = findSubtreeOffset(*right);
    int leftOffset = leftOffsetStart;
    int rightOffset = rightOffsetStart;

    const auto getMember = [&](bool isLeft, const TType& type, int member, TIntermTyped* splitNode, int splitMember,
                               bool flattened)
                           -> TIntermTyped * {
        const bool split     = isLeft ? isSplitLeft   : isSplitRight;

        TIntermTyped* subTree;
        const TType derefType(type, member);
        const TVariable* builtInVar = nullptr;
        if ((flattened || split) && derefType.isBuiltIn()) {
            auto splitPair = splitBuiltIns.find(HlslParseContext::tInterstageIoData(
                                                   derefType.getQualifier().builtIn,
                                                   isLeft ? leftStorage : rightStorage));
            if (splitPair != splitBuiltIns.end())
                builtInVar = splitPair->second;
        }
        if (builtInVar != nullptr) {
            // copy from interstage IO built-in if needed
            subTree = intermediate.addSymbol(*builtInVar);

            if (subTree->getType().isArray()) {
                // Arrayness of builtIn symbols isn't handled by the normal recursion:
                // it's been extracted and moved to the built-in.
                if (!arrayElement.empty()) {
                    const TType splitDerefType(subTree->getType(), arrayElement.back());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.back(), loc), loc);
                    subTree->setType(splitDerefType);
                } else if (splitNode->getAsOperator() != nullptr && (splitNode->getAsOperator()->getOp() == EOpIndexIndirect)) {
                    // This might also be a stage with arrayed outputs, in which case there's an index
                    // operation we should transfer to the output builtin.

                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else if (flattened && !shouldFlatten(derefType, isLeft ? leftStorage : rightStorage, false)) {
            if (isLeft) {
                // offset will cycle through variables for arrayed io
                if (leftOffset >= static_cast<int>(leftVariables->size()))
                    leftOffset = leftOffsetStart;
                subTree = intermediate.addSymbol(*(*leftVariables)[leftOffset++]);
            } else {
                // offset will cycle through variables for arrayed io
                if (rightOffset >= static_cast<int>(rightVariables->size()))
                    rightOffset = rightOffsetStart;
                subTree = intermediate.addSymbol(*(*rightVariables)[rightOffset++]);
            }

            // arrayed io
            if (subTree->getType().isArray()) {
                if (!arrayElement.empty()) {
                    const TType derefType(subTree->getType(), arrayElement.front());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.front(), loc), loc);
                    subTree->setType(derefType);
                } else {
                    // There's an index operation we should transfer to the output builtin.
                    assert(splitNode->getAsOperator() != nullptr &&
                           splitNode->getAsOperator()->getOp() == EOpIndexIndirect);
                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else {
            // Index operator if it's an aggregate, else EOpNull
            const TOperator accessOp = type.isArray()  ? EOpIndexDirect
                                     : type.isStruct() ? EOpIndexDirectStruct
                                     : EOpNull;
            if (accessOp == EOpNull) {
                subTree = splitNode;
            } else {
                subTree = intermediate.addIndex(accessOp, splitNode, intermediate.addConstantUnion(splitMember, loc),
                                                loc);
                const TType splitDerefType(splitNode->getType(), splitMember);
                subTree->setType(splitDerefType);
            }
        }

        return subTree;
    };

    // Use the proper RHS node: a new symbol from a TVariable, copy
    // of an TIntermSymbol node, or sometimes the right node directly.
    right = rhsTempVar != nullptr   ? intermediate.addSymbol(*rhsTempVar, loc) :
            cloneSymNode != nullptr ? intermediate.addSymbol(*cloneSymNode) :
            right;

    // Cannot use auto here, because this is recursive, and auto can't work out the type without seeing the
    // whole thing.  So, we'll resort to an explicit type via std::function.
    const std::function<void(TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                             bool topLevel)>
    traverse = [&](TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                   bool topLevel) -> void {
        // If we get here, we are assigning to or from a whole array or struct that must be
        // flattened, so have to do member-by-member assignment:

        bool shouldFlattenSubsetLeft = isFlattenLeft && shouldFlatten(left->getType(), leftStorage, topLevel);
        bool shouldFlattenSubsetRight = isFlattenRight && shouldFlatten(right->getType(), rightStorage, topLevel);

        if ((left->getType().isArray() || right->getType().isArray()) &&
              (shouldFlattenSubsetLeft  || isSplitLeft ||
               shouldFlattenSubsetRight || isSplitRight)) {
            const int elementsL = left->getType().isArray()  ? left->getType().getOuterArraySize()  : 1;
            const int elementsR = right->getType().isArray() ? right->getType().getOuterArraySize() : 1;

            // The arrays might not be the same size,
            // e.g., if the size has been forced for EbvTessLevelInner/Outer.
            const int elementsToCopy = std::min(elementsL, elementsR);

            // array case
            for (int element = 0; element < elementsToCopy; ++element) {
                arrayElement.push_back(element);

                // Add a new AST symbol node if we have a temp variable holding a complex RHS.
                TIntermTyped* subLeft  = getMember(true,  left->getType(),  element, left, element,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), element, right, element,
                                                   shouldFlattenSubsetRight);

                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  element, splitLeft,
                                                                       element, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), element, splitRight,
                                                                       element, shouldFlattenSubsetRight)
                                                           : subRight;

                traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);

                arrayElement.pop_back();
            }
        } else if (left->getType().isStruct() && (shouldFlattenSubsetLeft  || isSplitLeft ||
                                                  shouldFlattenSubsetRight || isSplitRight)) {
            // struct case
            const auto& membersL = *left->getType().getStruct();
            const auto& membersR = *right->getType().getStruct();

            // These track the members in the split structures corresponding to the same in the unsplit structures,
            // which we traverse in parallel.
            int memberL = 0;
            int memberR = 0;

            // Handle empty structure assignment
            if (int(membersL.size()) == 0 && int(membersR.size()) == 0)
                assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);

            for (int member = 0; member < int(membersL.size()); ++member) {
                const TType& typeL = *membersL[member].type;
                const TType& typeR = *membersR[member].type;

                TIntermTyped* subLeft  = getMember(true,  left->getType(), member, left, member,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), member, right, member,
                                                   shouldFlattenSubsetRight);

                // If there is no splitting, use the same values to avoid inefficiency.
                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  member, splitLeft,
                                                                       memberL, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), member, splitRight,
                                                                       memberR, shouldFlattenSubsetRight)
                                                           : subRight;

                if (isClipOrCullDistance(subSplitLeft->getType()) || isClipOrCullDistance(subSplitRight->getType())) {
                    // Clip and cull distance built-in assignment is complex in its own right, and is handled in
                    // a separate function dedicated to that task.  See comment above assignClipCullDistance;

                    const bool isOutput = isClipOrCullDistance(subSplitLeft->getType());

                    // Since all clip/cull semantics boil down to the same built-in type, we need to get the
                    // semantic ID from the dereferenced type's layout location, to avoid an N-1 mapping.
                    const TType derefType((isOutput ? left : right)->getType(), member);
                    const int semanticId = derefType.getQualifier().layoutLocation;

                    TIntermAggregate* clipCullAssign = assignClipCullDistance(loc, op, semanticId,
                                                                              subSplitLeft, subSplitRight);

                    assignList = intermediate.growAggregate(assignList, clipCullAssign, loc);
                } else if (subSplitRight->getType().getQualifier().builtIn == EbvFragCoord) {
                    // FragCoord can require special handling: see comment above assignFromFragCoord
                    TIntermTyped* fragCoordAssign = assignFromFragCoord(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, fragCoordAssign, loc);
                } else if (assignsClipPos(subSplitLeft)) {
                    // Position can require special handling: see comment above assignPosition
                    TIntermTyped* positionAssign = assignPosition(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, positionAssign, loc);
                } else if (!shouldFlattenSubsetLeft && !shouldFlattenSubsetRight &&
                           !typeL.containsBuiltIn() && !typeR.containsBuiltIn()) {
                    // If this is the final flattening (no nested types below to flatten)
                    // we'll copy the member, else recurse into the type hierarchy.
                    // However, if splitting the struct, that means we can copy a whole
                    // subtree here IFF it does not itself contain any interstage built-in
                    // IO variables, so we only have to recurse into it if there's something
                    // for splitting to do.  That can save a lot of AST verbosity for
                    // a bunch of memberwise copies.

                    assignList = intermediate.growAggregate(assignList,
                                                            intermediate.addAssign(op, subSplitLeft, subSplitRight, loc),
                                                            loc);
                } else {
                    traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);
                }

                memberL += (typeL.isBuiltIn() ? 0 : 1);
                memberR += (typeR.isBuiltIn() ? 0 : 1);
            }
        } else {
            // Member copy
            assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);
        }

    };

    TIntermTyped* splitLeft  = left;
    TIntermTyped* splitRight = right;

    // If either left or right was a split structure, we must read or write it, but still have to
    // parallel-recurse through the unsplit structure to identify the built-in IO vars.
    // The left can be either a symbol, or an index into a symbol (e.g, array reference)
    if (isSplitLeft) {
        if (indexesSplit(left)) {
            // Index case: Refer to the indexed symbol, if the left is an index operator.
            const TIntermSymbol* symNode = left->getAsBinaryNode()->getLeft()->getAsSymbolNode();

            TIntermTyped* splitLeftNonIo = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);

            splitLeft = intermediate.addIndex(left->getAsBinaryNode()->getOp(), splitLeftNonIo,
                                              left->getAsBinaryNode()->getRight(), loc);

            const TType derefType(splitLeftNonIo->getType(), 0);
            splitLeft->setType(derefType);
        } else {
            // Symbol case: otherwise, if not indexed, we have the symbol directly.
            const TIntermSymbol* symNode = left->getAsSymbolNode();
            splitLeft = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);
        }
    }

    if (isSplitRight)
        splitRight = intermediate.addSymbol(*getSplitNonIoVar(right->getAsSymbolNode()->getId()), loc);

    // This makes the whole assignment, recursing through subtypes as needed.
    traverse(left, right, splitLeft, splitRight, true);

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}